

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long *local_270 [2];
  long local_260 [2];
  string shader_source;
  long *local_230 [2];
  long local_220 [2];
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shader_source,shader_start_abi_cxx11_,DAT_02227518 + shader_start_abi_cxx11_
            );
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"    float","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_50,local_70,2);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90," a","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_90,local_b0,0);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"b","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_d0,local_f0,1);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"c","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_110,local_130,2);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"d","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_150,local_170,3);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"e","");
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_190,local_1b0,4);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"f","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_1d0,local_1f0,5);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"g","");
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_270,this,local_210,local_230,6);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_270[0]);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  std::__cxx11::string::append((char *)&shader_source);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
  case COMPUTE_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case GEOMETRY_SHADER_TYPE:
    puVar1 = &emit_quad_abi_cxx11_;
    goto LAB_00b4f93b;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar1 = &set_tesseation_abi_cxx11_;
LAB_00b4f93b:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x5fe);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar8 = (undefined1 *)&shader_source;
  std::__cxx11::string::_M_append(puVar8,shader_end_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    puVar7 = (undefined1 *)&shader_source;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    break;
  case VERTEX_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    puVar4 = default_tc_shader_source_abi_cxx11_;
    puVar5 = (undefined1 *)&shader_source;
    goto LAB_00b4fa18;
  case COMPUTE_SHADER_TYPE:
    puVar5 = empty_string_abi_cxx11_;
    puVar4 = empty_string_abi_cxx11_;
    puVar3 = empty_string_abi_cxx11_;
    puVar6 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    goto LAB_00b4fa1f;
  case GEOMETRY_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = (undefined1 *)&shader_source;
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    puVar4 = (undefined1 *)&shader_source;
    goto LAB_00b4fa11;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    puVar3 = (undefined1 *)&shader_source;
    goto LAB_00b4fa0a;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x601);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b4fa0a:
  puVar4 = default_tc_shader_source_abi_cxx11_;
LAB_00b4fa11:
  puVar5 = default_vertex_shader_source_abi_cxx11_;
LAB_00b4fa18:
  puVar8 = empty_string_abi_cxx11_;
LAB_00b4fa1f:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,puVar5,puVar4,puVar3,puVar6,puVar7,puVar8,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = shader_start;

	shader_source += this->extend_string("    float", "[2]", 2);
	shader_source += this->extend_string(" a", "[2]", 0);
	shader_source += ", ";
	shader_source += this->extend_string("b", "[2]", 1);
	shader_source += ", ";
	shader_source += this->extend_string("c", "[2]", 2);
	shader_source += ", ";
	shader_source += this->extend_string("d", "[2]", 3);
	shader_source += ", ";
	shader_source += this->extend_string("e", "[2]", 4);
	shader_source += ", ";
	shader_source += this->extend_string("f", "[2]", 5);
	shader_source += ", ";
	shader_source += this->extend_string("g", "[2]", 6);
	shader_source += ";\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}